

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int i2cZip(uint handle,char *inBuf,uint inLen,char *outBuf,uint outLen)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  long in_RCX;
  long lVar4;
  uint in_EDX;
  char *in_RSI;
  uint in_EDI;
  uint in_R8D;
  pi_i2c_msg_t segs [42];
  int setesc;
  int esc;
  int addr;
  int flags;
  int bytes;
  int status;
  int outPos;
  int inPos;
  int numSegs;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  uint in_stack_fffffffffffffc94;
  uint in_stack_fffffffffffffcc4;
  pi_i2c_msg_t *in_stack_fffffffffffffcc8;
  FILE *pFVar5;
  undefined8 in_stack_fffffffffffffcd0;
  ushort local_2f8 [4];
  long alStack_2f0 [84];
  int local_50;
  uint local_4c;
  uint32_t local_48;
  int local_44;
  int local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  int local_30;
  uint local_2c;
  long local_28;
  uint local_1c;
  char *local_18;
  uint local_10;
  uint local_c;
  
  pFVar5 = _stderr;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_EDI;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    uVar1 = local_10;
    pcVar3 = myBuf2Str(in_stack_fffffffffffffc94,
                       (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    fprintf(pFVar5,"%s %s: handle=%d inBuf=%s outBuf=%08X len=%d\n",pcVar2,"i2cZip",(ulong)uVar1,
            pcVar3,(int)local_28,local_2c);
  }
  pFVar5 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar5,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"i2cZip");
    }
    local_c = 0xffffffe1;
  }
  else if (local_10 < 0x40) {
    if (i2cInfo[local_10].state == 2) {
      if ((local_18 == (char *)0x0) || (local_1c == 0)) {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar2 = myTimeStamp();
          fprintf(pFVar5,"%s %s: input buffer can\'t be NULL\n",pcVar2,"i2cZip");
        }
        local_c = 0xffffffa6;
      }
      else if ((local_28 == 0) && (local_2c != 0)) {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar2 = myTimeStamp();
          fprintf(pFVar5,"%s %s: output buffer can\'t be NULL\n",pcVar2,"i2cZip");
        }
        local_c = 0xffffffa6;
      }
      else {
        local_30 = 0;
        local_34 = 0;
        local_38 = 0;
        local_3c = 0;
        local_48 = i2cInfo[local_10].addr;
        local_44 = 0;
        local_4c = 0;
        while( true ) {
          pFVar5 = _stderr;
          local_50 = 0;
          uVar1 = in_stack_fffffffffffffcc4 & 0xffffff;
          if (local_3c == 0) {
            uVar1 = CONCAT13(local_34 < local_1c,(int3)in_stack_fffffffffffffcc4);
          }
          in_stack_fffffffffffffcc4 = uVar1;
          if ((char)(in_stack_fffffffffffffcc4 >> 0x18) == '\0') break;
          if ((4 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
            pcVar2 = myTimeStamp();
            fprintf(pFVar5,"%s %s: status=%d inpos=%d inlen=%d cmd=%d addr=%d flags=%x\n",pcVar2,
                    "i2cZip",(ulong)local_3c,(ulong)local_34,local_1c,(int)local_18[(int)local_34],
                    local_48,local_44);
          }
          lVar4 = (long)(int)local_34;
          local_34 = local_34 + 1;
          switch(local_18[lVar4]) {
          case '\0':
            local_3c = 1;
            break;
          case '\x01':
            local_50 = 1;
            break;
          case '\x02':
            if (local_30 != 0) {
              local_3c = i2cSegments((uint)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                                     in_stack_fffffffffffffcc4);
              if (-1 < (int)local_3c) {
                local_3c = 0;
              }
              local_30 = 0;
            }
            i2cSwitchCombined(in_stack_fffffffffffffc94);
            break;
          case '\x03':
            if (local_30 != 0) {
              local_3c = i2cSegments((uint)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                                     in_stack_fffffffffffffcc4);
              if (-1 < (int)local_3c) {
                local_3c = 0;
              }
              local_30 = 0;
            }
            i2cSwitchCombined(in_stack_fffffffffffffc94);
            break;
          case '\x04':
            local_48 = myI2CGetPar(local_18,(int *)&local_34,local_1c,(int *)&local_4c);
            if ((int)local_48 < 0) {
              local_3c = 0xffffff91;
            }
            break;
          case '\x05':
            local_4c = 1;
            local_44 = myI2CGetPar(local_18,(int *)&local_34,local_1c,(int *)&local_4c);
            if (local_44 < 0) {
              local_3c = 0xffffff91;
            }
            break;
          case '\x06':
            local_40 = myI2CGetPar(local_18,(int *)&local_34,local_1c,(int *)&local_4c);
            if (local_40 < 0) {
              local_3c = 0xffffff92;
            }
            else if (local_40 + local_38 < local_2c) {
              local_2f8[(long)local_30 * 8] = (ushort)local_48;
              local_2f8[(long)local_30 * 8 + 1] = (ushort)local_44 | 1;
              local_2f8[(long)local_30 * 8 + 2] = (ushort)local_40;
              alStack_2f0[(long)local_30 * 2] = local_28 + (int)local_38;
              local_38 = local_40 + local_38;
              local_30 = local_30 + 1;
              if (0x29 < local_30) {
                local_3c = i2cSegments((uint)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                                       in_stack_fffffffffffffcc4);
                if (-1 < (int)local_3c) {
                  local_3c = 0;
                }
                local_30 = 0;
              }
            }
            else {
              local_3c = 0xffffff92;
            }
            break;
          case '\a':
            local_40 = myI2CGetPar(local_18,(int *)&local_34,local_1c,(int *)&local_4c);
            if (local_40 < 0) {
              local_3c = 0xffffff93;
            }
            else if (local_40 + local_34 < local_1c) {
              local_2f8[(long)local_30 * 8] = (ushort)local_48;
              local_2f8[(long)local_30 * 8 + 1] = (ushort)local_44 & 0xfffe;
              local_2f8[(long)local_30 * 8 + 2] = (ushort)local_40;
              alStack_2f0[(long)local_30 * 2] = (long)(local_18 + (int)local_34);
              local_34 = local_40 + local_34;
              local_30 = local_30 + 1;
              if (0x29 < local_30) {
                local_3c = i2cSegments((uint)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                                       in_stack_fffffffffffffcc4);
                if (-1 < (int)local_3c) {
                  local_3c = 0;
                }
                local_30 = 0;
              }
            }
            else {
              local_3c = 0xffffff93;
            }
            break;
          default:
            local_3c = 0xffffff91;
          }
          local_4c = (uint)(local_50 != 0);
        }
        if ((-1 < (int)local_3c) && (local_30 != 0)) {
          local_3c = i2cSegments((uint)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                                 in_stack_fffffffffffffcc4);
        }
        if (-1 < (int)local_3c) {
          local_3c = local_38;
        }
        local_c = local_3c;
      }
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar5,"%s %s: bad handle (%d)\n",pcVar2,"i2cZip",(ulong)local_10);
      }
      local_c = 0xffffffe7;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar5,"%s %s: bad handle (%d)\n",pcVar2,"i2cZip",(ulong)local_10);
    }
    local_c = 0xffffffe7;
  }
  return local_c;
}

Assistant:

int i2cZip(
   unsigned handle,
   char *inBuf, unsigned inLen, char *outBuf, unsigned outLen)
{
   int numSegs, inPos, outPos, status, bytes, flags, addr;
   int esc, setesc;
   pi_i2c_msg_t segs[PI_I2C_RDRW_IOCTL_MAX_MSGS];

   DBG(DBG_USER, "handle=%d inBuf=%s outBuf=%08X len=%d",
      handle, myBuf2Str(inLen, (char *)inBuf), (int)outBuf, outLen);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (!inBuf || !inLen)
      SOFT_ERROR(PI_BAD_POINTER, "input buffer can't be NULL");

   if (!outBuf && outLen)
      SOFT_ERROR(PI_BAD_POINTER, "output buffer can't be NULL");

   numSegs = 0;

   inPos = 0;
   outPos = 0;
   status = 0;

   addr = i2cInfo[handle].addr;
   flags = 0;
   esc = 0;
   setesc = 0;

   while (!status && (inPos < inLen))
   {
      DBG(DBG_INTERNAL, "status=%d inpos=%d inlen=%d cmd=%d addr=%d flags=%x",
         status, inPos, inLen, inBuf[inPos], addr, flags);

      switch (inBuf[inPos++])
      {
         case PI_I2C_END:
            status = 1;
            break;

         case PI_I2C_COMBINED_ON:
            /* Run prior transactions before setting combined flag */
            if (numSegs)
            {
               status = i2cSegments(handle, segs, numSegs);
               if (status >= 0) status = 0; /* continue */
               numSegs = 0;
            }
            i2cSwitchCombined(1);
            break;

         case PI_I2C_COMBINED_OFF:
            /* Run prior transactions before clearing combined flag */
            if (numSegs)
            {
               status = i2cSegments(handle, segs, numSegs);
               if (status >= 0) status = 0; /* continue */
               numSegs = 0;
            }
            i2cSwitchCombined(0);
            break;

         case PI_I2C_ADDR:
            addr = myI2CGetPar(inBuf, &inPos, inLen, &esc);
            if (addr < 0) status = PI_BAD_I2C_CMD;
            break;

         case PI_I2C_FLAGS:
            /* cheat to force two byte flags */
            esc = 1;
            flags = myI2CGetPar(inBuf, &inPos, inLen, &esc);
            if (flags < 0) status = PI_BAD_I2C_CMD;
            break;

         case PI_I2C_ESC:
            setesc = 1;
            break;

         case PI_I2C_READ:

            bytes = myI2CGetPar(inBuf, &inPos, inLen, &esc);

            if (bytes >= 0)
            {
               if ((bytes + outPos) < outLen)
               {
                  segs[numSegs].addr = addr;
                  segs[numSegs].flags = (flags|1);
                  segs[numSegs].len = bytes;
                  segs[numSegs].buf = (uint8_t *)(outBuf + outPos);
                  outPos += bytes;
                  numSegs++;
                  if (numSegs >= PI_I2C_RDRW_IOCTL_MAX_MSGS)
                  {
                     status = i2cSegments(handle, segs, numSegs);
                     if (status >= 0) status = 0; /* continue */
                     numSegs = 0;
                  }
               }
               else status = PI_BAD_I2C_RLEN;
            }
            else status = PI_BAD_I2C_RLEN;
            break;

         case PI_I2C_WRITE:

            bytes = myI2CGetPar(inBuf, &inPos, inLen, &esc);

            if (bytes >= 0)
            {
               if ((bytes + inPos) < inLen)
               {
                  segs[numSegs].addr = addr;
                  segs[numSegs].flags = (flags&0xfffe);
                  segs[numSegs].len = bytes;
                  segs[numSegs].buf = (uint8_t *)(inBuf + inPos);
                  inPos += bytes;
                  numSegs++;
                  if (numSegs >= PI_I2C_RDRW_IOCTL_MAX_MSGS)
                  {
                     status = i2cSegments(handle, segs, numSegs);
                     if (status >= 0) status = 0; /* continue */
                     numSegs = 0;
                  }
               }
               else status = PI_BAD_I2C_WLEN;
            }
            else status = PI_BAD_I2C_WLEN;
            break;

         default:
            status = PI_BAD_I2C_CMD;
      }

      if (setesc) esc = 1; else esc = 0;

      setesc = 0;
   }

   if (status >= 0)
   {
      if (numSegs) status = i2cSegments(handle, segs, numSegs);
   }

   if (status >= 0) status = outPos;

   return status;
}